

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::sortLinked(Earcut<unsigned_int> *this,Node *list)

{
  bool local_4e;
  int local_4c;
  int local_48;
  int inSize;
  int qSize;
  int pSize;
  int numMerges;
  int i;
  Node *tail;
  Node *e;
  Node *q;
  Node *p;
  Node *list_local;
  Earcut<unsigned_int> *this_local;
  
  if (list == (Node *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/mapbox/earcut/earcut.hpp"
                  ,0x22c,
                  "typename Earcut<N>::Node *mapbox::detail::Earcut<>::sortLinked(Node *) [N = unsigned int]"
                 );
  }
  local_4c = 1;
  p = list;
  do {
    q = p;
    p = (Node *)0x0;
    _numMerges = (Node *)0x0;
    qSize = 0;
    while (q != (Node *)0x0) {
      qSize = qSize + 1;
      e = q;
      inSize = 0;
      for (pSize = 0; pSize < local_4c; pSize = pSize + 1) {
        inSize = inSize + 1;
        e = e->nextZ;
        if (e == (Node *)0x0) break;
      }
      local_48 = local_4c;
      while( true ) {
        local_4e = true;
        if (inSize < 1) {
          local_4e = 0 < local_48 && e != (Node *)0x0;
        }
        if (!local_4e) break;
        if (inSize == 0) {
          tail = e;
          e = e->nextZ;
          local_48 = local_48 + -1;
        }
        else if ((local_48 == 0) || (e == (Node *)0x0)) {
          tail = q;
          q = q->nextZ;
          inSize = inSize + -1;
        }
        else if (e->z < q->z) {
          tail = e;
          e = e->nextZ;
          local_48 = local_48 + -1;
        }
        else {
          tail = q;
          q = q->nextZ;
          inSize = inSize + -1;
        }
        if (_numMerges == (Node *)0x0) {
          p = tail;
        }
        else {
          _numMerges->nextZ = tail;
        }
        tail->prevZ = _numMerges;
        _numMerges = tail;
      }
      q = e;
    }
    _numMerges->nextZ = (Node *)0x0;
    if (qSize < 2) {
      return p;
    }
    local_4c = local_4c << 1;
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::sortLinked(Node* list) {
    assert(list);
    Node* p;
    Node* q;
    Node* e;
    Node* tail;
    int i, numMerges, pSize, qSize;
    int inSize = 1;

    for (;;) {
        p = list;
        list = nullptr;
        tail = nullptr;
        numMerges = 0;

        while (p) {
            numMerges++;
            q = p;
            pSize = 0;
            for (i = 0; i < inSize; i++) {
                pSize++;
                q = q->nextZ;
                if (!q) break;
            }

            qSize = inSize;

            while (pSize > 0 || (qSize > 0 && q)) {

                if (pSize == 0) {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                } else if (qSize == 0 || !q) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else if (p->z <= q->z) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                }

                if (tail) tail->nextZ = e;
                else list = e;

                e->prevZ = tail;
                tail = e;
            }

            p = q;
        }

        tail->nextZ = nullptr;

        if (numMerges <= 1) return list;

        inSize *= 2;
    }
}